

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O2

void sha256_hash(uchar *data,unsigned_long len,sha256_ctx *ctx)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  void *__dest;
  ulong uVar5;
  ulong uStack_40;
  
  uVar3 = (int)len + ctx->count[0];
  uVar1 = ctx->count[0] & 0x3f;
  ctx->count[0] = uVar3;
  if (uVar3 < len) {
    ctx->count[1] = ctx->count[1] + 1;
  }
  uStack_40 = 0x40 - (ulong)uVar1;
  uVar4 = (ulong)uVar1;
  while( true ) {
    __dest = (void *)((long)ctx->wbuf + uVar4);
    uVar5 = len - uStack_40;
    if (len < uStack_40) break;
    memcpy(__dest,data,uStack_40);
    data = data + uStack_40;
    for (lVar2 = 0x19; lVar2 != 9; lVar2 = lVar2 + -1) {
      uVar1 = ctx->count[lVar2];
      ctx->count[lVar2] =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    }
    sha256_compile(ctx);
    uVar4 = 0;
    uStack_40 = 0x40;
    len = uVar5;
  }
  memcpy(__dest,data,len);
  return;
}

Assistant:

void sha256_hash(const unsigned char data[], unsigned long len, sha256_ctx ctx[1])
{   sha2_32t pos = (sha2_32t)(ctx->count[0] & SHA256_MASK), 
             space = SHA256_BLOCK_SIZE - pos;
    const unsigned char *sp = data;

    if((ctx->count[0] += len) < len)
        ++(ctx->count[1]);

    while(len >= space)     /* tranfer whole blocks while possible  */
    {
        memcpy(((unsigned char*)ctx->wbuf) + pos, sp, space);
        sp += space; len -= space; space = SHA256_BLOCK_SIZE; pos = 0; 
                bsw_32(ctx->wbuf, SHA256_BLOCK_SIZE >> 2)
        sha256_compile(ctx);
    }

    memcpy(((unsigned char*)ctx->wbuf) + pos, sp, len);
}